

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O3

void __thiscall ncnn::Mat::create_like(Mat *this,Mat *m,Allocator *_allocator)

{
  switch(m->dims) {
  case 1:
    create(this,m->w,m->elemsize,m->elempack,_allocator);
    return;
  case 2:
    create(this,m->w,m->h,m->elemsize,m->elempack,_allocator);
    return;
  case 3:
    create(this,m->w,m->h,m->c,m->elemsize,m->elempack,_allocator);
    break;
  case 4:
    create(this,m->w,m->h,m->d,m->c,m->elemsize,m->elempack,_allocator);
  }
  return;
}

Assistant:

void Mat::create_like(const Mat& m, Allocator* _allocator)
{
    int _dims = m.dims;
    if (_dims == 1)
        create(m.w, m.elemsize, m.elempack, _allocator);
    if (_dims == 2)
        create(m.w, m.h, m.elemsize, m.elempack, _allocator);
    if (_dims == 3)
        create(m.w, m.h, m.c, m.elemsize, m.elempack, _allocator);
    if (_dims == 4)
        create(m.w, m.h, m.d, m.c, m.elemsize, m.elempack, _allocator);
}